

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

AnonymousProgramSyntax * __thiscall
slang::parsing::Parser::parseAnonymousProgram(Parser *this,AttrList attributes)

{
  SyntaxNode *pSVar1;
  bool bVar2;
  int iVar3;
  Diagnostic *this_00;
  SourceLocation SVar4;
  undefined4 extraout_var;
  AnonymousProgramSyntax *pAVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  Token TVar9;
  SourceRange range;
  string_view arg;
  Token semi;
  Token keyword;
  bool anyLocalModules;
  MemberSyntax *member;
  Token endkeyword;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  bool local_121;
  MemberSyntax *local_120;
  Preprocessor *local_118;
  pointer local_110;
  size_t local_108;
  Info *local_100;
  undefined8 local_f8;
  Info *local_f0;
  undefined8 local_e8;
  Token *local_e0;
  Token *local_d8;
  Token local_d0;
  Token local_c0;
  SyntaxNode *local_b0;
  SyntaxNode *pSStack_a8;
  pointer local_98;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_88;
  
  local_108 = (size_t)attributes._M_extent._M_extent_value;
  local_110 = attributes._M_ptr;
  local_118 = (this->super_ParserBase).window.tokenSource;
  local_118->designElementDepth = local_118->designElementDepth + 1;
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  local_f0 = TVar9.info;
  local_e8 = TVar9._0_8_;
  TVar9 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_100 = TVar9.info;
  local_f8 = TVar9._0_8_;
  Token::Token(&local_d0);
  local_88.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_88.super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_88.super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x8;
  local_121 = false;
  local_d8 = &(this->super_ParserBase).lastPoppedDelims.first;
  local_e0 = &(this->super_ParserBase).lastPoppedDelims.second;
  bVar6 = false;
  while( true ) {
    TVar9 = ParserBase::peek(&this->super_ParserBase);
    if ((TVar9.kind == EndOfFile) || ((TVar9._0_4_ & 0xffff) == 0x9b)) break;
    local_120 = parseMember(this,AnonymousProgram,&local_121);
    bVar8 = local_120 == (MemberSyntax *)0x0;
    if (bVar8) {
      bVar2 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar9.kind);
      if (bVar2) {
        local_c0 = ParserBase::peek(&this->super_ParserBase);
        range = Token::range(&local_c0);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
        local_c0 = ParserBase::peek(&this->super_ParserBase);
        arg = Token::valueText(&local_c0);
        Diagnostic::operator<<(this_00,arg);
        bVar7 = 0;
        if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
           ((this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
          SVar4 = Token::location(local_d8);
          Diagnostic::addNote(this_00,(DiagCode)0xc10005,SVar4);
          SVar4 = Token::location(local_e0);
          Diagnostic::addNote(this_00,(DiagCode)0xc00005,SVar4);
          bVar7 = 0;
        }
      }
      else {
        bVar7 = ~bVar6 & 1;
      }
      ParserBase::skipToken
                (&this->super_ParserBase,
                 (optional<slang::DiagCode>)((uint6)bVar7 << 0x20 | 0x450005));
      bVar6 = bVar8;
    }
    else {
      checkMemberAllowed(this,&local_120->super_SyntaxNode,AnonymousProgram);
      SmallVectorBase<slang::syntax::MemberSyntax*>::
      emplace_back<slang::syntax::MemberSyntax*const&>
                ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&local_88,&local_120);
      pSVar1 = this->previewNode;
      this->previewNode = (SyntaxNode *)0x0;
      (local_120->super_SyntaxNode).previewNode = pSVar1;
      bVar6 = bVar8;
    }
  }
  if (local_121 == true) {
    SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::pop_back(&(this->moduleDeclStack).
                super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              );
  }
  local_d0 = ParserBase::expect(&this->super_ParserBase,EndProgramKeyword);
  iVar3 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                    ((SmallVectorBase<slang::syntax::MemberSyntax_*> *)&local_88,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)local_d0.info);
  local_98 = (pointer)CONCAT44(extraout_var,iVar3);
  if ((SyntaxNode **)local_88.super_SyntaxListBase._vptr_SyntaxListBase !=
      &local_88.super_SyntaxListBase.super_SyntaxNode.previewNode) {
    operator_delete(local_88.super_SyntaxListBase._vptr_SyntaxListBase);
  }
  local_118->designElementDepth = local_118->designElementDepth + -1;
  local_88.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_88.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_88.super_SyntaxListBase.childCount = local_108;
  local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       local_110;
  local_88.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_108;
  local_88.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00698d40;
  local_c0.info._0_4_ = 1;
  local_b0 = (SyntaxNode *)0x0;
  pSStack_a8 = (SyntaxNode *)0x0;
  local_c0._0_8_ = &PTR_getChild_00698e30;
  semi.info = local_100;
  semi.kind = (undefined2)local_f8;
  semi._2_1_ = local_f8._2_1_;
  semi.numFlags.raw = local_f8._3_1_;
  semi.rawLen = local_f8._4_4_;
  keyword.info = local_f0;
  keyword.kind = (undefined2)local_e8;
  keyword._2_1_ = local_e8._2_1_;
  keyword.numFlags.raw = local_e8._3_1_;
  keyword.rawLen = local_e8._4_4_;
  pAVar5 = slang::syntax::SyntaxFactory::anonymousProgram
                     (&this->factory,&local_88,keyword,semi,
                      (SyntaxList<slang::syntax::MemberSyntax> *)&local_c0,local_d0);
  return pAVar5;
}

Assistant:

AnonymousProgramSyntax& Parser::parseAnonymousProgram(AttrList attributes) {
    auto& pp = getPP();
    pp.pushDesignElementStack();

    auto keyword = consume();
    auto semi = expect(TokenKind::Semicolon);

    Token endkeyword;
    auto members = parseMemberList<MemberSyntax>(
        TokenKind::EndProgramKeyword, endkeyword, SyntaxKind::AnonymousProgram,
        [this](SyntaxKind parentKind, bool& anyLocalModules) {
            return parseMember(parentKind, anyLocalModules);
        });

    pp.popDesignElementStack();

    return factory.anonymousProgram(attributes, keyword, semi, members, endkeyword);
}